

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

bool __thiscall ObjectFile::startTransaction(ObjectFile *this,Access param_1)

{
  bool bVar1;
  File *this_00;
  MutexLocker lock;
  string local_30;
  
  MutexLocker::MutexLocker(&lock,this->objectMutex);
  if (this->inTransaction == false) {
    this_00 = (File *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_30,(string *)&this->lockpath);
    File::File(this_00,&local_30,this->umask,false,true,true,true);
    this->transactionLockFile = this_00;
    std::__cxx11::string::~string((string *)&local_30);
    bVar1 = File::isValid(this->transactionLockFile);
    if (bVar1) {
      bVar1 = File::lock(this->transactionLockFile,true);
      if (bVar1) {
        this->inTransaction = true;
        bVar1 = true;
        goto LAB_0012fc1a;
      }
    }
    if (this->transactionLockFile != (File *)0x0) {
      (*this->transactionLockFile->_vptr_File[1])();
    }
    this->transactionLockFile = (File *)0x0;
    bVar1 = false;
    softHSMLog(3,"startTransaction",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x310,"Failed to lock file %s for attribute transaction",
               (this->lockpath)._M_dataplus._M_p);
  }
  else {
    bVar1 = false;
  }
LAB_0012fc1a:
  MutexLocker::~MutexLocker(&lock);
  return bVar1;
}

Assistant:

bool ObjectFile::startTransaction(Access)
{
	MutexLocker lock(objectMutex);

	if (inTransaction)
	{
		return false;
	}

	transactionLockFile = new File(lockpath, umask, false, true, true);

	if (!transactionLockFile->isValid() || !transactionLockFile->lock())
	{
		delete transactionLockFile;
		transactionLockFile = NULL;

		ERROR_MSG("Failed to lock file %s for attribute transaction", lockpath.c_str());

		return false;
	}

	inTransaction = true;

	return true;
}